

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_divu_16_di(void)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar2 = m68ki_cpu.ir;
  uVar3 = OPER_AY_DI_16();
  if (uVar3 != 0) {
    uVar5 = uVar2 >> 9 & 7;
    uVar1 = (ulong)m68ki_cpu.dar[uVar5] / (ulong)uVar3;
    uVar4 = (uint)uVar1;
    if (uVar4 < 0x10000) {
      m68ki_cpu.n_flag = (uint)(uVar1 >> 8);
      m68ki_cpu.v_flag = 0;
      m68ki_cpu.c_flag = 0;
      m68ki_cpu.not_z_flag = uVar4;
      m68ki_cpu.dar[uVar5] = m68ki_cpu.dar[uVar5] % uVar3 << 0x10 | uVar4;
    }
    else {
      m68ki_cpu.v_flag = 0x80;
    }
    return;
  }
  m68ki_exception_trap(5);
  return;
}

Assistant:

static void m68k_op_divu_16_di(void)
{
	uint* r_dst = &DX;
	uint src = OPER_AY_DI_16();

	if(src != 0)
	{
		uint quotient = *r_dst / src;
		uint remainder = *r_dst % src;

		if(quotient < 0x10000)
		{
			FLAG_Z = quotient;
			FLAG_N = NFLAG_16(quotient);
			FLAG_V = VFLAG_CLEAR;
			FLAG_C = CFLAG_CLEAR;
			*r_dst = MASK_OUT_ABOVE_32(MASK_OUT_ABOVE_16(quotient) | (remainder << 16));
			return;
		}
		FLAG_V = VFLAG_SET;
		return;
	}
	m68ki_exception_trap(EXCEPTION_ZERO_DIVIDE);
}